

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void chrono::
     _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
               (list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                *contactlist,ReportContactCallback *mcallback)

{
  _List_node_base *p_Var1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  p_Var3 = (contactlist->
           super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var3 == (_List_node_base *)contactlist) {
      return;
    }
    p_Var1 = p_Var3[1]._M_next;
    local_50 = p_Var1[0xb]._M_next;
    local_58 = p_Var1[0xb]._M_prev;
    (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(local_48);
    iVar2 = (*mcallback->_vptr_ReportContactCallback[2])
                      (mcallback,p_Var1 + 2,&p_Var1[3]._M_prev,&p_Var1[6]._M_prev,&local_50,
                       &local_58,local_48,&VNULL,p_Var3[1]._M_next[1]._M_next,
                       p_Var3[1]._M_next[1]._M_prev);
    if ((char)iVar2 == '\0') break;
    p_Var3 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  return;
}

Assistant:

void _ReportAllContacts(std::list<Tcont*>& contactlist, ChContactContainer::ReportContactCallback* mcallback) {
    typename std::list<Tcont*>::iterator itercontact = contactlist.begin();
    while (itercontact != contactlist.end()) {
        bool proceed = mcallback->OnReportContact(
            (*itercontact)->GetContactP1(), (*itercontact)->GetContactP2(), (*itercontact)->GetContactPlane(),
            (*itercontact)->GetContactDistance(), (*itercontact)->GetEffectiveCurvatureRadius(),
            (*itercontact)->GetContactForce(), VNULL, (*itercontact)->GetObjA(), (*itercontact)->GetObjB());
        if (!proceed)
            break;
        ++itercontact;
    }
}